

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWrd.h
# Opt level: O1

void Vec_WrdPush(Vec_Wrd_t *p,word Entry)

{
  uint uVar1;
  word *pwVar2;
  int iVar3;
  
  uVar1 = p->nCap;
  if (p->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (p->pArray == (word *)0x0) {
        pwVar2 = (word *)malloc(0x80);
      }
      else {
        pwVar2 = (word *)realloc(p->pArray,0x80);
      }
      p->pArray = pwVar2;
      iVar3 = 0x10;
    }
    else {
      iVar3 = uVar1 * 2;
      if (iVar3 <= (int)uVar1) goto LAB_00884aff;
      if (p->pArray == (word *)0x0) {
        pwVar2 = (word *)malloc((ulong)uVar1 << 4);
      }
      else {
        pwVar2 = (word *)realloc(p->pArray,(ulong)uVar1 << 4);
      }
      p->pArray = pwVar2;
    }
    if (pwVar2 == (word *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                    ,0x1e4,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
    }
    p->nCap = iVar3;
  }
LAB_00884aff:
  iVar3 = p->nSize;
  p->nSize = iVar3 + 1;
  p->pArray[iVar3] = Entry;
  return;
}

Assistant:

static inline void Vec_WrdPush( Vec_Wrd_t * p, word Entry )
{
    if ( p->nSize == p->nCap )
    {
        if ( p->nCap < 16 )
            Vec_WrdGrow( p, 16 );
        else
            Vec_WrdGrow( p, 2 * p->nCap );
    }
    p->pArray[p->nSize++] = Entry;
}